

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUISkin::CGUISkin(CGUISkin *this,EGUI_SKIN_TYPE type,IVideoDriver *driver)

{
  s32 sVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  s32 sVar9;
  s32 sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  
  lVar2 = 0;
  *(undefined8 *)&this->field_0x270 = 0;
  *(undefined4 *)&this->field_0x278 = 1;
  (this->super_IGUISkin)._vptr_IGUISkin = (_func_int **)0x26ffa8;
  *(undefined8 *)&this->field_0x268 = 0x270088;
  this->SpriteBank = (IGUISpriteBank *)0x0;
  do {
    *(long *)((long)&this->Texts[0].str._M_dataplus._M_p + lVar2) =
         (long)&this->Texts[0].str.field_2 + lVar2;
    *(undefined8 *)((long)&this->Texts[0].str._M_string_length + lVar2) = 0;
    *(undefined4 *)((long)&this->Texts[0].str.field_2 + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x100);
  this->Driver = driver;
  this->Type = type;
  if (type < EGST_BURNING_SKIN) {
    *(undefined8 *)&(this->super_IGUISkin).field_0x8 = 0x6582828265323232;
    *(undefined4 *)&(this->super_IGUISkin).field_0x10 = 0x65d2d2d2;
    sVar9 = 2;
    sVar10 = 0;
    uVar3 = 0xff787878;
    uVar4 = 0xfff0f0ff;
    uVar5 = 0xc8ffffff;
    uVar6 = 0xc808246b;
    uVar7 = 0xf0646464;
    uVar8 = 0xffffffff;
    uVar11 = 0xc8ffffe1;
    uVar12 = 0x65e6e6e6;
    uVar13 = 0x65ffffff;
    uVar14 = 0xc80a0a0a;
    uVar15 = 0xf0ffffff;
    uVar16 = 0x65a5a5a5;
    uVar17 = 0xff1e1e1e;
    uVar18 = 0xc8000000;
    uVar19 = 0x65646464;
    uVar20 = 0xf00a0a0a;
    uVar21 = 0xf0828282;
    uVar22 = 0x6508246b;
    uVar23 = 0x65ffffff;
    uVar24 = 0x65d2d2d2;
    uVar25 = 0x65100e73;
    uVar26 = 0xffffffff;
    sVar1 = 0x1e;
  }
  else {
    *(undefined8 *)&(this->super_IGUISkin).field_0x8 = 0x50e4e8f160767982;
    *(undefined4 *)&(this->super_IGUISkin).field_0x10 = 0xc0cbd2d9;
    sVar9 = 3;
    sVar10 = 2;
    uVar3 = 0xf0cccccc;
    uVar4 = 0xf0fffff0;
    uVar5 = 0xd0161616;
    uVar6 = 0xd0606060;
    uVar7 = 0x3c101010;
    uVar8 = 0xf0ffffff;
    uVar11 = 0xc0cbd2d9;
    uVar12 = 0xf0e0e0e0;
    uVar13 = 0xf0f0f0f0;
    uVar14 = 0xd0161616;
    uVar15 = 0xd0e0e0e0;
    uVar16 = 0xf0a5a5a5;
    uVar17 = 0xffd2d2d2;
    uVar18 = 0xf00f2033;
    uVar19 = 0xc0646464;
    uVar20 = 0xd0161616;
    uVar21 = 0x3c141414;
    uVar22 = 0x6c606060;
    uVar23 = 0x40c7ccdc;
    uVar24 = 0x802e313a;
    uVar25 = 0x80404040;
    uVar26 = 0xffd0d0d0;
    sVar1 = 0x30;
  }
  *(undefined4 *)&(this->super_IGUISkin).field_0x14 = uVar23;
  *(undefined4 *)&(this->super_IGUISkin).field_0x18 = uVar24;
  *(undefined4 *)&(this->super_IGUISkin).field_0x1c = uVar25;
  *(undefined4 *)&this->field_0x20 = uVar26;
  *(undefined4 *)&this->field_0x24 = uVar19;
  *(undefined4 *)&this->field_0x28 = uVar20;
  *(undefined4 *)&this->field_0x2c = uVar21;
  *(undefined4 *)&this->field_0x30 = uVar22;
  *(undefined4 *)&this->field_0x34 = uVar15;
  *(undefined4 *)&this->field_0x38 = uVar16;
  *(undefined4 *)&this->field_0x3c = uVar17;
  *(undefined4 *)&this->field_0x40 = uVar18;
  *(undefined4 *)&this->field_0x44 = uVar11;
  *(undefined4 *)&this->field_0x48 = uVar12;
  *(undefined4 *)&this->field_0x4c = uVar13;
  *(undefined4 *)&this->field_0x50 = uVar14;
  *(undefined4 *)&this->field_0x54 = uVar5;
  *(undefined4 *)&this->field_0x58 = uVar6;
  *(undefined4 *)&this->field_0x5c = uVar7;
  *(undefined4 *)&this->field_0x60 = uVar8;
  *(ulong *)&this->field_0x64 = CONCAT44(uVar4,uVar3);
  this->Sizes[0] = 0xe;
  this->Sizes[1] = sVar1;
  this->Sizes[2] = 0xf;
  this->Sizes[3] = 0x12;
  this->Sizes[4] = 500;
  this->Sizes[5] = 200;
  this->Sizes[6] = 0x50;
  this->Sizes[7] = 0x1e;
  this->Sizes[8] = sVar9;
  this->Sizes[9] = sVar10;
  this->Sizes[10] = sVar9;
  this->Sizes[0xb] = sVar10;
  this->Sizes[0xc] = 0xf;
  this->Sizes[0xd] = 0;
  this->Sizes[0xe] = 500;
  this->Sizes[0xf] = 0;
  this->Sizes[0x10] = 99999;
  this->Sizes[0x11] = 1;
  this->Sizes[0x12] = 1;
  this->Sizes[0x13] = 0;
  this->Sizes[0x14] = 2;
  this->Sizes[0x15] = 0;
  this->Sizes[0x16] = 0;
  core::string<wchar_t>::operator=(this->Texts,L"OK");
  core::string<wchar_t>::operator=(this->Texts + 1,L"Cancel");
  core::string<wchar_t>::operator=(this->Texts + 2,L"Yes");
  core::string<wchar_t>::operator=(this->Texts + 3,L"No");
  core::string<wchar_t>::operator=(this->Texts + 4,L"Close");
  core::string<wchar_t>::operator=(this->Texts + 7,L"Restore");
  core::string<wchar_t>::operator=(this->Texts + 6,L"Minimize");
  core::string<wchar_t>::operator=(this->Texts + 5,L"Maximize");
  this->Icons[0] = 0xe1;
  this->Icons[1] = 0xe2;
  this->Icons[2] = 0xe3;
  this->Icons[3] = 0xe4;
  this->Icons[8] = 0xe8;
  this->Icons[9] = 0xe8;
  this->Icons[10] = 0xe9;
  this->Icons[0xb] = 0xea;
  this->Icons[0xc] = 0xeb;
  this->Icons[0xd] = 0xec;
  this->Icons[0xe] = 0xed;
  this->Icons[0xf] = 0xee;
  this->Icons[4] = 0xf2;
  this->Icons[5] = 0xe5;
  this->Icons[6] = 0xe6;
  this->Icons[7] = 0xe7;
  this->Icons[0x10] = 0xef;
  this->Icons[0x11] = 0xf0;
  this->Icons[0x12] = 0xf1;
  this->Icons[0x13] = 0xf3;
  this->Icons[0x14] = 0xf4;
  this->Icons[0x15] = 0xf5;
  this->Icons[0x16] = 0xf6;
  this->Fonts[0] = (IGUIFont *)0x0;
  this->Fonts[1] = (IGUIFont *)0x0;
  this->Fonts[2] = (IGUIFont *)0x0;
  this->Fonts[3] = (IGUIFont *)0x0;
  this->Fonts[4] = (IGUIFont *)0x0;
  this->UseGradient = this->Type - EGST_WINDOWS_METALLIC < 2;
  return;
}

Assistant:

CGUISkin::CGUISkin(EGUI_SKIN_TYPE type, video::IVideoDriver *driver) :
		SpriteBank(0), Driver(driver), Type(type)
{
#ifdef _DEBUG
	setDebugName("CGUISkin");
#endif

	if ((Type == EGST_WINDOWS_CLASSIC) || (Type == EGST_WINDOWS_METALLIC)) {
		Colors[EGDC_3D_DARK_SHADOW] = video::SColor(101, 50, 50, 50);
		Colors[EGDC_3D_SHADOW] = video::SColor(101, 130, 130, 130);
		Colors[EGDC_3D_FACE] = video::SColor(101, 210, 210, 210);
		Colors[EGDC_3D_HIGH_LIGHT] = video::SColor(101, 255, 255, 255);
		Colors[EGDC_3D_LIGHT] = video::SColor(101, 210, 210, 210);
		Colors[EGDC_ACTIVE_BORDER] = video::SColor(101, 16, 14, 115);
		Colors[EGDC_ACTIVE_CAPTION] = video::SColor(255, 255, 255, 255);
		Colors[EGDC_APP_WORKSPACE] = video::SColor(101, 100, 100, 100);
		Colors[EGDC_BUTTON_TEXT] = video::SColor(240, 10, 10, 10);
		Colors[EGDC_GRAY_TEXT] = video::SColor(240, 130, 130, 130);
		Colors[EGDC_HIGH_LIGHT] = video::SColor(101, 8, 36, 107);
		Colors[EGDC_HIGH_LIGHT_TEXT] = video::SColor(240, 255, 255, 255);
		Colors[EGDC_INACTIVE_BORDER] = video::SColor(101, 165, 165, 165);
		Colors[EGDC_INACTIVE_CAPTION] = video::SColor(255, 30, 30, 30);
		Colors[EGDC_TOOLTIP] = video::SColor(200, 0, 0, 0);
		Colors[EGDC_TOOLTIP_BACKGROUND] = video::SColor(200, 255, 255, 225);
		Colors[EGDC_SCROLLBAR] = video::SColor(101, 230, 230, 230);
		Colors[EGDC_WINDOW] = video::SColor(101, 255, 255, 255);
		Colors[EGDC_WINDOW_SYMBOL] = video::SColor(200, 10, 10, 10);
		Colors[EGDC_ICON] = video::SColor(200, 255, 255, 255);
		Colors[EGDC_ICON_HIGH_LIGHT] = video::SColor(200, 8, 36, 107);
		Colors[EGDC_GRAY_WINDOW_SYMBOL] = video::SColor(240, 100, 100, 100);
		Colors[EGDC_EDITABLE] = video::SColor(255, 255, 255, 255);
		Colors[EGDC_GRAY_EDITABLE] = video::SColor(255, 120, 120, 120);
		Colors[EGDC_FOCUSED_EDITABLE] = video::SColor(255, 240, 240, 255);

		Sizes[EGDS_SCROLLBAR_SIZE] = 14;
		Sizes[EGDS_MENU_HEIGHT] = 30;
		Sizes[EGDS_WINDOW_BUTTON_WIDTH] = 15;
		Sizes[EGDS_CHECK_BOX_WIDTH] = 18;
		Sizes[EGDS_MESSAGE_BOX_WIDTH] = 500;
		Sizes[EGDS_MESSAGE_BOX_HEIGHT] = 200;
		Sizes[EGDS_BUTTON_WIDTH] = 80;
		Sizes[EGDS_BUTTON_HEIGHT] = 30;

		Sizes[EGDS_TEXT_DISTANCE_X] = 2;
		Sizes[EGDS_TEXT_DISTANCE_Y] = 0;

		Sizes[EGDS_TITLEBARTEXT_DISTANCE_X] = 2;
		Sizes[EGDS_TITLEBARTEXT_DISTANCE_Y] = 0;
	} else {
		// 0x80a6a8af
		Colors[EGDC_3D_DARK_SHADOW] = 0x60767982;
		// Colors[EGDC_3D_FACE]			=	0xc0c9ccd4;		// tab background
		Colors[EGDC_3D_FACE] = 0xc0cbd2d9;   // tab background
		Colors[EGDC_3D_SHADOW] = 0x50e4e8f1; // tab background, and left-top highlight
		Colors[EGDC_3D_HIGH_LIGHT] = 0x40c7ccdc;
		Colors[EGDC_3D_LIGHT] = 0x802e313a;
		Colors[EGDC_ACTIVE_BORDER] = 0x80404040; // window title
		Colors[EGDC_ACTIVE_CAPTION] = 0xffd0d0d0;
		Colors[EGDC_APP_WORKSPACE] = 0xc0646464; // unused
		Colors[EGDC_BUTTON_TEXT] = 0xd0161616;
		Colors[EGDC_GRAY_TEXT] = 0x3c141414;
		Colors[EGDC_HIGH_LIGHT] = 0x6c606060;
		Colors[EGDC_HIGH_LIGHT_TEXT] = 0xd0e0e0e0;
		Colors[EGDC_INACTIVE_BORDER] = 0xf0a5a5a5;
		Colors[EGDC_INACTIVE_CAPTION] = 0xffd2d2d2;
		Colors[EGDC_TOOLTIP] = 0xf00f2033;
		Colors[EGDC_TOOLTIP_BACKGROUND] = 0xc0cbd2d9;
		Colors[EGDC_SCROLLBAR] = 0xf0e0e0e0;
		Colors[EGDC_WINDOW] = 0xf0f0f0f0;
		Colors[EGDC_WINDOW_SYMBOL] = 0xd0161616;
		Colors[EGDC_ICON] = 0xd0161616;
		Colors[EGDC_ICON_HIGH_LIGHT] = 0xd0606060;
		Colors[EGDC_GRAY_WINDOW_SYMBOL] = 0x3c101010;
		Colors[EGDC_EDITABLE] = 0xf0ffffff;
		Colors[EGDC_GRAY_EDITABLE] = 0xf0cccccc;
		Colors[EGDC_FOCUSED_EDITABLE] = 0xf0fffff0;

		Sizes[EGDS_SCROLLBAR_SIZE] = 14;
		Sizes[EGDS_MENU_HEIGHT] = 48;
		Sizes[EGDS_WINDOW_BUTTON_WIDTH] = 15;
		Sizes[EGDS_CHECK_BOX_WIDTH] = 18;
		Sizes[EGDS_MESSAGE_BOX_WIDTH] = 500;
		Sizes[EGDS_MESSAGE_BOX_HEIGHT] = 200;
		Sizes[EGDS_BUTTON_WIDTH] = 80;
		Sizes[EGDS_BUTTON_HEIGHT] = 30;

		Sizes[EGDS_TEXT_DISTANCE_X] = 3;
		Sizes[EGDS_TEXT_DISTANCE_Y] = 2;

		Sizes[EGDS_TITLEBARTEXT_DISTANCE_X] = 3;
		Sizes[EGDS_TITLEBARTEXT_DISTANCE_Y] = 2;
	}

	Sizes[EGDS_MESSAGE_BOX_GAP_SPACE] = 15;
	Sizes[EGDS_MESSAGE_BOX_MIN_TEXT_WIDTH] = 0;
	Sizes[EGDS_MESSAGE_BOX_MAX_TEXT_WIDTH] = 500;
	Sizes[EGDS_MESSAGE_BOX_MIN_TEXT_HEIGHT] = 0;
	Sizes[EGDS_MESSAGE_BOX_MAX_TEXT_HEIGHT] = 99999;

	Sizes[EGDS_BUTTON_PRESSED_IMAGE_OFFSET_X] = 1;
	Sizes[EGDS_BUTTON_PRESSED_IMAGE_OFFSET_Y] = 1;
	Sizes[EGDS_BUTTON_PRESSED_TEXT_OFFSET_X] = 0;
	Sizes[EGDS_BUTTON_PRESSED_TEXT_OFFSET_Y] = 2;
	Sizes[EGDS_BUTTON_PRESSED_SPRITE_OFFSET_X] = 0;
	Sizes[EGDS_BUTTON_PRESSED_SPRITE_OFFSET_Y] = 0;

	Texts[EGDT_MSG_BOX_OK] = L"OK";
	Texts[EGDT_MSG_BOX_CANCEL] = L"Cancel";
	Texts[EGDT_MSG_BOX_YES] = L"Yes";
	Texts[EGDT_MSG_BOX_NO] = L"No";
	Texts[EGDT_WINDOW_CLOSE] = L"Close";
	Texts[EGDT_WINDOW_RESTORE] = L"Restore";
	Texts[EGDT_WINDOW_MINIMIZE] = L"Minimize";
	Texts[EGDT_WINDOW_MAXIMIZE] = L"Maximize";

	Icons[EGDI_WINDOW_MAXIMIZE] = 225;
	Icons[EGDI_WINDOW_RESTORE] = 226;
	Icons[EGDI_WINDOW_CLOSE] = 227;
	Icons[EGDI_WINDOW_MINIMIZE] = 228;
	Icons[EGDI_CURSOR_UP] = 229;
	Icons[EGDI_CURSOR_DOWN] = 230;
	Icons[EGDI_CURSOR_LEFT] = 231;
	Icons[EGDI_CURSOR_RIGHT] = 232;
	Icons[EGDI_MENU_MORE] = 232;
	Icons[EGDI_CHECK_BOX_CHECKED] = 233;
	Icons[EGDI_DROP_DOWN] = 234;
	Icons[EGDI_SMALL_CURSOR_UP] = 235;
	Icons[EGDI_SMALL_CURSOR_DOWN] = 236;
	Icons[EGDI_RADIO_BUTTON_CHECKED] = 237;
	Icons[EGDI_MORE_LEFT] = 238;
	Icons[EGDI_MORE_RIGHT] = 239;
	Icons[EGDI_MORE_UP] = 240;
	Icons[EGDI_MORE_DOWN] = 241;
	Icons[EGDI_WINDOW_RESIZE] = 242;
	Icons[EGDI_EXPAND] = 243;
	Icons[EGDI_COLLAPSE] = 244;

	Icons[EGDI_FILE] = 245;
	Icons[EGDI_DIRECTORY] = 246;

	for (u32 i = 0; i < EGDF_COUNT; ++i)
		Fonts[i] = 0;

	UseGradient = (Type == EGST_WINDOWS_METALLIC) || (Type == EGST_BURNING_SKIN);
}